

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenStreamException.hpp
# Opt level: O0

void __thiscall antlr::TokenStreamException::~TokenStreamException(TokenStreamException *this)

{
  void *in_RDI;
  
  ~TokenStreamException((TokenStreamException *)0x1b8a28);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

virtual ~TokenStreamException() throw()
	{
	}